

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O2

void __thiscall leveldb::Block::Iter::SeekToLast(Iter *this)

{
  bool bVar1;
  
  SeekToRestartPoint(this,this->num_restarts_ - 1);
  do {
    bVar1 = ParseNextKey(this);
    if (!bVar1) {
      return;
    }
  } while ((uint)((*(int *)&(this->value_).data_ + (int)(this->value_).size_) - *(int *)&this->data_
                 ) < this->restarts_);
  return;
}

Assistant:

void SeekToLast() override {
    SeekToRestartPoint(num_restarts_ - 1);
    while (ParseNextKey() && NextEntryOffset() < restarts_) {
      // Keep skipping
    }
  }